

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWire.hpp
# Opt level: O2

void __thiscall gmlc::concurrency::TripWireDetector::TripWireDetector(TripWireDetector *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  TripWire::getLine();
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lineDetector).super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_18;
  (this->lineDetector).super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_pi;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return;
}

Assistant:

TripWireDetector(): lineDetector(TripWire::getLine()) {}